

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalValueDatabase.cpp
# Opt level: O1

void __thiscall
OptimalValueDatabase::OptimalValueDatabase
          (OptimalValueDatabase *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  _Rb_tree_header *p_Var1;
  DecPOMDPDiscreteInterface *pDVar2;
  double dVar3;
  
  p_Var1 = &(this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header;
  (this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_m_optimalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  (this->_filename)._M_string_length = 0;
  (this->_filename).field_2._M_local_buf[0] = '\0';
  pDVar2 = pu->_m_DecPOMDP;
  (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0x40)) + 0x20))
            (&this->_m_problemName,(long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0x40));
  pDVar2 = pu->_m_DecPOMDP;
  dVar3 = (double)(**(code **)(*(long *)((long)&pDVar2->field_0x0 +
                                        *(long *)(*(long *)pDVar2 + -0xb0)) + 0x70))
                            ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  this->_m_discount = dVar3;
  this->_m_horizon = (pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  Load(this);
  return;
}

Assistant:

OptimalValueDatabase::OptimalValueDatabase(
    const PlanningUnitDecPOMDPDiscrete* pu) :
    _m_problemName(pu->GetDPOMDPD()->GetUnixName()),
    _m_discount(pu->GetDiscount()),
    _m_horizon(pu->GetHorizon())
{
    Load();
}